

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidySaveSink(TidyDoc tdoc,TidyOutputSink *sink)

{
  int iVar1;
  TidyDocImpl *doc;
  TidyOutputSink *sink_local;
  TidyDoc tdoc_local;
  
  iVar1 = tidyDocSaveSink((TidyDocImpl *)tdoc,sink);
  return iVar1;
}

Assistant:

int TIDY_CALL        tidySaveSink( TidyDoc tdoc, TidyOutputSink* sink )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocSaveSink( doc, sink );
}